

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopDfs.c
# Opt level: O1

Hop_Obj_t * Hop_Transfer(Hop_Man_t *pSour,Hop_Man_t *pDest,Hop_Obj_t *pRoot,int nVars)

{
  undefined8 *puVar1;
  Vec_Ptr_t *pVVar2;
  Hop_Obj_t *pHVar3;
  Hop_Obj_t *pObj;
  long lVar4;
  
  if (pSour != pDest) {
    pObj = (Hop_Obj_t *)((ulong)pRoot & 0xfffffffffffffffe);
    if ((*(uint *)&pObj->field_0x20 & 7) == 1) {
      pObj = (Hop_Obj_t *)&pDest->pConst1;
    }
    else {
      if ((nVars != 0) && (pVVar2 = pSour->vPis, 0 < pVVar2->nSize)) {
        lVar4 = 0;
        do {
          puVar1 = (undefined8 *)pVVar2->pArray[lVar4];
          pHVar3 = Hop_IthVar(pDest,(int)lVar4);
          *puVar1 = pHVar3;
          if ((ulong)(uint)nVars - 1 == lVar4) break;
          lVar4 = lVar4 + 1;
          pVVar2 = pSour->vPis;
        } while (lVar4 < pVVar2->nSize);
      }
      Hop_Transfer_rec(pDest,pObj);
      Hop_ConeUnmark_rec(pObj);
    }
    pRoot = (Hop_Obj_t *)((ulong)((uint)pRoot & 1) ^ (ulong)(pObj->field_0).pData);
  }
  return pRoot;
}

Assistant:

Hop_Obj_t * Hop_Transfer( Hop_Man_t * pSour, Hop_Man_t * pDest, Hop_Obj_t * pRoot, int nVars )
{
    Hop_Obj_t * pObj;
    int i;
    // solve simple cases
    if ( pSour == pDest )
        return pRoot;
    if ( Hop_ObjIsConst1( Hop_Regular(pRoot) ) )
        return Hop_NotCond( Hop_ManConst1(pDest), Hop_IsComplement(pRoot) );
    // set the PI mapping
    Hop_ManForEachPi( pSour, pObj, i )
    {
        if ( i == nVars )
           break;
        pObj->pData = Hop_IthVar(pDest, i);
    }
    // transfer and set markings
    Hop_Transfer_rec( pDest, Hop_Regular(pRoot) );
    // clear the markings
    Hop_ConeUnmark_rec( Hop_Regular(pRoot) );
    return Hop_NotCond( (Hop_Obj_t *)Hop_Regular(pRoot)->pData, Hop_IsComplement(pRoot) );
}